

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerNewScObjArray(Lowerer *this,Instr *newObjInstr)

{
  OpCode opcode;
  Func *func;
  RegOpnd *baseOpnd;
  Instr *this_00;
  Func *func_00;
  ScriptContextInfo *pSVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  byte bVar5;
  ArgSlot AVar6;
  BailOutKind BVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Instr *pIVar11;
  undefined4 *puVar12;
  JITTimeFunctionBody *pJVar13;
  JITTimeProfileInfo *pJVar14;
  ArrayCallSiteInfo *pAVar15;
  LabelInstr *pLVar16;
  Lowerer *pLVar17;
  Opnd *pOVar18;
  Opnd *src1Opnd;
  Opnd *src2Opnd;
  ProfiledInstr *instr;
  RegOpnd *pRVar19;
  StackSym *pSVar20;
  AddrOpnd *pAVar21;
  HelperCallOpnd *this_01;
  IndirOpnd *pIVar22;
  undefined4 extraout_var_00;
  BranchInstr *branchInstr;
  IntConstOpnd *src;
  intptr_t iVar23;
  ProfileId index;
  Lowerer *pLVar24;
  Instr *local_88;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_7a;
  Lowerer *local_78;
  ArrayCallSiteInfo *local_70;
  LabelInstr *local_68;
  uint local_5c;
  Opnd *local_58;
  intptr_t local_50;
  LabelInstr *local_48;
  Lowerer *local_40;
  LabelInstr *local_38;
  Lowerer *this_02;
  undefined4 extraout_var;
  
  bVar3 = IR::Instr::HasEmptyArgOutChain(newObjInstr,(Instr **)0x0);
  if (bVar3) {
    IR::Instr::FreeSrc2(newObjInstr);
    pIVar11 = LowerNewScObjArrayNoArg(this,newObjInstr);
    return pIVar11;
  }
  func = newObjInstr->m_func;
  pLVar24 = (Lowerer *)newObjInstr->m_src1;
  pLVar17 = pLVar24;
  OVar4 = IR::Opnd::GetKind((Opnd *)pLVar24);
  if (OVar4 == OpndKindAddr) {
    local_88 = InsertLoweredRegionStartMarker(pLVar17,newObjInstr);
    instr = (ProfiledInstr *)newObjInstr;
  }
  else {
    if (((newObjInstr->field_0x38 & 0x10) == 0) ||
       (pLVar17 = (Lowerer *)newObjInstr, bVar3 = IR::Instr::OnlyHasLazyBailOut(newObjInstr), bVar3)
       ) {
      pIVar11 = LowerNewScObject(this,newObjInstr,true,true,false);
      return pIVar11;
    }
    local_40 = this;
    local_88 = InsertLoweredRegionStartMarker(pLVar17,newObjInstr);
    BVar7 = IR::Instr::GetBailOutKind(newObjInstr);
    if ((BVar7 != BailOutOnNotNativeArray) &&
       (BVar7 = IR::Instr::GetBailOutKind(newObjInstr),
       BVar7 != (LazyBailOut|BailOutOnNotNativeArray))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1462,
                         "(newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray))"
                         ,
                         "newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)"
                        );
      if (!bVar3) goto LAB_0059d20d;
      *puVar12 = 0;
    }
    pLVar16 = IR::LabelInstr::New(Label,func,false);
    iVar10 = (*newObjInstr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x10])();
    pLVar17 = (Lowerer *)CONCAT44(extraout_var,iVar10);
    pAVar21 = IR::AddrOpnd::New((intptr_t)pLVar17,AddrOpndKindDynamicVar,newObjInstr->m_func,false,
                                (Var)0x0);
    local_78 = pLVar24;
    local_38 = pLVar16;
    InsertCompareBranch(pLVar17,(Opnd *)pLVar24,&pAVar21->super_Opnd,BrEq_A,true,pLVar16,newObjInstr
                        ,false);
    opcode = newObjInstr->m_opcode;
    pOVar18 = IR::Instr::UnlinkDst(newObjInstr);
    src1Opnd = IR::Instr::UnlinkSrc1(newObjInstr);
    src2Opnd = IR::Instr::UnlinkSrc2(newObjInstr);
    instr = IR::ProfiledInstr::New(opcode,pOVar18,src1Opnd,src2Opnd,func);
    if (newObjInstr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar3) goto LAB_0059d20d;
      *puVar12 = 0;
    }
    (instr->u).profileId = *(uint *)&newObjInstr[1]._vptr_Instr;
    IR::Instr::InsertAfter(newObjInstr,&instr->super_Instr);
    this = local_40;
    newObjInstr->m_opcode = BailOut;
    GenerateBailOut(local_40,newObjInstr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    IR::Instr::InsertBefore(&instr->super_Instr,&local_38->super_Instr);
    pLVar24 = local_78;
  }
  if ((instr->super_Instr).m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1480,"(newObjInstr->IsProfiledInstr())","newObjInstr->IsProfiledInstr()");
    if (!bVar3) goto LAB_0059d20d;
    *puVar12 = 0;
  }
  baseOpnd = (RegOpnd *)(instr->super_Instr).m_dst;
  OVar4 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0059d20d;
    *puVar12 = 0;
  }
  pLVar17 = (Lowerer *)(instr->super_Instr).m_next;
  if ((instr->super_Instr).m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
    if (!bVar3) goto LAB_0059d20d;
    *puVar12 = 0;
  }
  local_5c = (instr->u).profileId & 0xffff;
  local_38 = (LabelInstr *)0x0;
  local_70 = (ArrayCallSiteInfo *)0x0;
  iVar23 = 0;
  local_78 = pLVar24;
  if ((~(instr->u).profileId & 0xffff) != 0) {
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    pJVar14 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar13);
    index = (ProfileId)local_5c;
    pAVar15 = JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar14,index);
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    pJVar14 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar13);
    local_38 = (LabelInstr *)JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar14,index);
    local_70 = pAVar15;
    if (pAVar15 == (ArrayCallSiteInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x148c,"(arrayInfo)","arrayInfo");
      if (!bVar3) goto LAB_0059d20d;
      *puVar12 = 0;
    }
    iVar23 = Func::GetWeakFuncRef(func);
    if (iVar23 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x148e,"(weakFuncRef)","weakFuncRef");
      if (!bVar3) goto LAB_0059d20d;
      *puVar12 = 0;
      iVar23 = 0;
    }
  }
  local_50 = iVar23;
  local_68 = IR::LabelInstr::New(Label,func,true);
  local_48 = IR::LabelInstr::New(Label,func,false);
  pOVar18 = (instr->super_Instr).m_src2;
  OVar4 = IR::Opnd::GetKind(pOVar18);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1495,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
    if (!bVar3) goto LAB_0059d20d;
    *puVar12 = 0;
  }
  OVar4 = IR::Opnd::GetKind(pOVar18);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar3) goto LAB_0059d20d;
    *puVar12 = 0;
  }
  pSVar20 = (StackSym *)pOVar18[1]._vptr_Opnd;
  if ((pSVar20->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) goto LAB_0059d20d;
    *puVar12 = 0;
  }
  pIVar11 = (pSVar20->field_5).m_instrDef;
  local_40 = this;
  if ((pSVar20->field_0x18 & pIVar11 != (Instr *)0x0) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1497,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar3) goto LAB_0059d20d;
    *puVar12 = 0;
    if ((pSVar20->field_0x18 & 1) == 0) {
      pIVar11 = (Instr *)0x0;
    }
    else {
      pIVar11 = (pSVar20->field_5).m_instrDef;
    }
  }
  pOVar18 = pIVar11->m_src1;
  local_7a = (pOVar18->m_valueType).field_0;
  bVar3 = ValueType::IsLikelyInt((ValueType *)&local_7a.field_0);
  if ((bVar3) &&
     (((OVar4 = IR::Opnd::GetKind(pOVar18), OVar4 == OpndKindAddr ||
       (OVar4 = IR::Opnd::GetKind(pOVar18), OVar4 == OpndKindReg)) &&
      (AVar6 = StackSym::GetArgSlotNum(pSVar20), AVar6 == 2)))) {
    uVar8 = *(uint *)&pSVar20->field_0x18 & 0x100000;
    if ((uVar8 != 0) && (*(short *)&(pSVar20->super_Sym).field_0x16 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_58 = (Opnd *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)&local_58->_vptr_Opnd = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
      if (!bVar3) goto LAB_0059d20d;
      *(undefined4 *)&local_58->_vptr_Opnd = 0;
      uVar8 = *(uint *)&pSVar20->field_0x18 & 0x100000;
    }
    if (uVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_58 = (Opnd *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)&local_58->_vptr_Opnd = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x14a3,"(linkSym->IsArgSlotSym())","Not an argSlot symbol...");
      if (!bVar3) goto LAB_0059d20d;
      *(undefined4 *)&local_58->_vptr_Opnd = 0;
    }
    local_58 = pIVar11->m_src2;
    OVar4 = IR::Opnd::GetKind(pOVar18);
    if (OVar4 == OpndKindReg) {
      OVar4 = IR::Opnd::GetKind(pOVar18);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) goto LAB_0059d20d;
        *puVar12 = 0;
      }
      bVar3 = IR::Opnd::IsNotInt(pOVar18);
      pAVar15 = local_70;
      if (!bVar3) {
        if (local_70 == (ArrayCallSiteInfo *)0x0) {
          pAVar15 = (ArrayCallSiteInfo *)0x0;
        }
        else {
          bVar5 = (local_70->field_0).bits;
          if ((bVar5 & 1) == 0) {
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase);
            if (!bVar3) {
              bVar3 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeIntArray>
                                (local_40,&instr->super_Instr,pAVar15,(intptr_t)local_38,local_50,
                                 local_68,local_48,pOVar18,0x1a,0x38);
              goto LAB_0059ce4d;
            }
            bVar5 = (pAVar15->field_0).bits;
          }
          if (((bVar5 & 2) == 0) &&
             (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase), !bVar3)) {
            bVar3 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeFloatArray>
                              (local_40,&instr->super_Instr,pAVar15,(intptr_t)local_38,local_50,
                               local_68,local_48,pOVar18,0x1a,0x38);
            goto LAB_0059ce4d;
          }
        }
        bVar3 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptArray>
                          (local_40,&instr->super_Instr,pAVar15,(intptr_t)local_38,local_50,local_68
                           ,local_48,pOVar18,0,0);
LAB_0059ce4d:
        if (bVar3 != false) {
          pRVar19 = IR::Opnd::AsRegOpnd(local_58);
          pSVar20 = Sym::AsStackSym(&pRVar19->m_sym->super_Sym);
          bVar3 = StackSym::IsArgSlotSym(pSVar20);
          if ((bVar3) || ((pSVar20->field_0x18 & 1) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x14cc,"(!linkSym->IsArgSlotSym() && linkSym->m_isSingleDef)",
                               "Arg tree not single def...");
            if (!bVar3) goto LAB_0059d20d;
            *puVar12 = 0;
          }
          this_00 = (pSVar20->field_5).m_instrDef;
          uVar9 = IR::Instr::GetArgOutCount(this_00,false);
          if (uVar9 != 2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x14cf,"(startCallInstr->GetArgOutCount(false) == 2)",
                               "Generating ArrayFastPath for more than 1 parameter not allowed.");
            if (!bVar3) goto LAB_0059d20d;
            *puVar12 = 0;
          }
          IR::Instr::Move(this_00,&instr->super_Instr);
          IR::Instr::Move(pIVar11,&instr->super_Instr);
        }
      }
    }
    else {
      uVar8 = StackSym::GetIntConstValue(pSVar20);
      if (uVar8 < 9) {
        bVar3 = GenerateProfiledNewScObjArrayFastPath
                          (local_40,&instr->super_Instr,local_70,(intptr_t)local_38,local_50,uVar8,
                           local_48,false);
        goto LAB_0059ce4d;
      }
    }
  }
  IR::Instr::UnlinkSrc1(&instr->super_Instr);
  pAVar21 = IR::AddrOpnd::New((intptr_t)local_38,AddrOpndKindDynamicArrayCallSiteInfo,func,false,
                              (Var)0x0);
  pLVar24 = local_40;
  LowererMD::LoadNewScObjFirstArg(&local_40->m_lowererMD,&instr->super_Instr,&pAVar21->super_Opnd,0)
  ;
  this_01 = IR::HelperCallOpnd::New(HelperScrArr_ProfiledNewInstance,func);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0059d20d;
    *puVar12 = 0;
  }
  func_00 = (instr->super_Instr).m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_0059d20d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar12 = 0;
    pLVar24 = local_40;
  }
  bVar5 = (this_01->super_Opnd).field_0xb;
  if ((bVar5 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func_00);
    bVar5 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar5 | 2;
  (instr->super_Instr).m_src1 = &this_01->super_Opnd;
  GenerateDirectCall(pLVar24,&instr->super_Instr,(Opnd *)local_78,1);
  pIVar22 = IR::IndirOpnd::New(baseOpnd,0,TyUint64,func,false);
  pSVar1 = ((pLVar17->m_lowererMD).lowererMDArch.m_func)->m_scriptContextInfo;
  iVar10 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,7);
  this_02 = (Lowerer *)CONCAT44(extraout_var_00,iVar10);
  pAVar21 = IR::AddrOpnd::New(this_02,AddrOpndKindDynamicVtable,pLVar24->m_func,false,(Var)0x0);
  pLVar16 = local_48;
  branchInstr = InsertCompareBranch(this_02,&pIVar22->super_Opnd,&pAVar21->super_Opnd,BrEq_A,true,
                                    local_48,(Instr *)pLVar17,false);
  LowererMD::InsertObjectPoison((Opnd *)baseOpnd,branchInstr,(Instr *)pLVar17,true);
  pIVar22 = IR::IndirOpnd::New(baseOpnd,0x1a,TyUint16,func,false);
  src = IR::Opnd::CreateProfileIdOpnd((ProfileId)local_5c,func);
  InsertMove(&pIVar22->super_Opnd,&src->super_Opnd,(Instr *)pLVar17,true);
  pIVar22 = IR::IndirOpnd::New(baseOpnd,0x38,TyInt64,func,false);
  pAVar21 = IR::AddrOpnd::New(local_50,AddrOpndKindDynamicFunctionBodyWeakRef,func,false,(Var)0x0);
  InsertMove(&pIVar22->super_Opnd,&pAVar21->super_Opnd,(Instr *)pLVar17,true);
  IR::Instr::InsertBefore((Instr *)pLVar17,&pLVar16->super_Instr);
  pIVar11 = RemoveLoweredRegionStartMarker(pLVar17,local_88);
  return pIVar11;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObjArray(IR::Instr *newObjInstr)
{
    if (newObjInstr->HasEmptyArgOutChain())
    {
        newObjInstr->FreeSrc2();
        return LowerNewScObjArrayNoArg(newObjInstr);
    }

    IR::Instr* startMarkerInstr = nullptr;

    IR::Opnd *targetOpnd = newObjInstr->GetSrc1();
    Func *func = newObjInstr->m_func;

    if (!targetOpnd->IsAddrOpnd())
    {
        if (!newObjInstr->HasBailOutInfo() || newObjInstr->OnlyHasLazyBailOut())
        {
            return this->LowerNewScObject(newObjInstr, true, true);
        }

        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

        // For whatever reason, we couldn't do a fixed function check on the call target.
        // Generate a runtime check on the target.
        Assert(
            newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray ||
            newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)
        );
        IR::LabelInstr *labelSkipBailOut = IR::LabelInstr::New(Js::OpCode::Label, func);
        InsertCompareBranch(
            targetOpnd,
            LoadLibraryValueOpnd(newObjInstr, LibraryValue::ValueArrayConstructor),
            Js::OpCode::BrEq_A,
            true,
            labelSkipBailOut,
            newObjInstr);

        IR::ProfiledInstr *instrNew = IR::ProfiledInstr::New(newObjInstr->m_opcode, newObjInstr->UnlinkDst(), newObjInstr->UnlinkSrc1(), newObjInstr->UnlinkSrc2(), func);
        instrNew->u.profileId = newObjInstr->AsProfiledInstr()->u.profileId;
        newObjInstr->InsertAfter(instrNew);
        newObjInstr->m_opcode = Js::OpCode::BailOut;
        GenerateBailOut(newObjInstr);

        instrNew->InsertBefore(labelSkipBailOut);
        newObjInstr = instrNew;
    }
    else
    {
        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);
    }

    intptr_t weakFuncRef = 0;
    Js::ArrayCallSiteInfo *arrayInfo = nullptr;
    intptr_t arrayInfoAddr = 0;
    Assert(newObjInstr->IsProfiledInstr());

    IR::RegOpnd *resultObjOpnd = newObjInstr->GetDst()->AsRegOpnd();
    IR::Instr * insertInstr = newObjInstr->m_next;

    Js::ProfileId profileId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);

    // We may not have profileId if we converted a NewScObject to NewScObjArray
    if (profileId != Js::Constants::NoProfileId)
    {
        arrayInfo = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
        arrayInfoAddr = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);
        Assert(arrayInfo);
        weakFuncRef = func->GetWeakFuncRef();
        Assert(weakFuncRef);
    }

    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::Opnd *linkOpnd = newObjInstr->GetSrc2();

    Assert(linkOpnd->IsSymOpnd());
    StackSym *linkSym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
    Assert(linkSym->IsSingleDef());
    IR::Instr* argInstr = linkSym->GetInstrDef();
    IR::Opnd *opndOfArrayCtor = argInstr->GetSrc1();
    const uint16 upperBoundValue = 8;
    // Generate fast path only if it meets all the conditions:
    // 1. It is the only parameter and it is a likely int
    // 2a. If 1st parameter is a variable, emit fast path with checks
    // 2b. If 1st parameter is a constant, it is in range 0 and upperBoundValue (inclusive)
    if (opndOfArrayCtor->GetValueType().IsLikelyInt() && (opndOfArrayCtor->IsAddrOpnd() || opndOfArrayCtor->IsRegOpnd())) // #1
    {
        if ((linkSym->GetArgSlotNum() == 2)) // 1. It is the only parameter
        {
            AssertMsg(linkSym->IsArgSlotSym(), "Not an argSlot symbol...");
            linkOpnd = argInstr->GetSrc2();

            bool emittedFastPath = false;
            // 2a. If 1st parameter is a variable, emit fast path with checks
            if (opndOfArrayCtor->IsRegOpnd())
            {
                if (!opndOfArrayCtor->AsRegOpnd()->IsNotInt())
                {
                    // 3. GenerateFastPath
                    if (arrayInfo && arrayInfo->IsNativeIntArray())
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeIntArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor,
                                                                Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex(),
                                                                Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef());
                    }
                    else if (arrayInfo && arrayInfo->IsNativeFloatArray())
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeFloatArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor,
                                                                  Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex(),
                                                                  Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef());
                    }
                    else
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor, 0, 0);
                    }
                }
            }
            // 2b. If 1st parameter is a constant, it is in range 0 and upperBoundValue (inclusive)
            else
            {
                int32 length = linkSym->GetIntConstValue();
                if (length >= 0 && length <= upperBoundValue)
                {
                    emittedFastPath = GenerateProfiledNewScObjArrayFastPath(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, (uint32)length, labelDone, false);
                }
            }
            // Since we emitted fast path above, move the startCall/argOut instruction right before helper
            if (emittedFastPath)
            {
                linkSym = linkOpnd->AsRegOpnd()->m_sym->AsStackSym();
                AssertMsg(!linkSym->IsArgSlotSym() && linkSym->m_isSingleDef, "Arg tree not single def...");

                IR::Instr* startCallInstr = linkSym->m_instrDef;
                AssertMsg(startCallInstr->GetArgOutCount(false) == 2, "Generating ArrayFastPath for more than 1 parameter not allowed.");

                // Since we emitted fast path above, move the startCall/argOut instruction right before helper
                startCallInstr->Move(newObjInstr);
                argInstr->Move(newObjInstr);
            }
        }
    }
    newObjInstr->UnlinkSrc1();

    IR::Opnd *profileOpnd = IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, func);
    this->m_lowererMD.LoadNewScObjFirstArg(newObjInstr, profileOpnd);

    IR::JnHelperMethod helperMethod = IR::HelperScrArr_ProfiledNewInstance;

    newObjInstr->SetSrc1(IR::HelperCallOpnd::New(helperMethod, func));
    newObjInstr = GenerateDirectCall(newObjInstr, targetOpnd, Js::CallFlags_New);

    IR::BranchInstr* branchInstr = InsertCompareBranch(
        IR::IndirOpnd::New(resultObjOpnd, 0, TyMachPtr, func),
        LoadVTableValueOpnd(insertInstr, VTableValue::VtableJavascriptArray),
        Js::OpCode::BrEq_A,
        true,
        labelDone,
        insertInstr);

    InsertObjectPoison(resultObjOpnd, branchInstr, insertInstr, true);
    // We know we have a native array, so store the weak ref and call site index.
    InsertMove(
        IR::IndirOpnd::New(resultObjOpnd, Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex(), TyUint16, func),
        IR::Opnd::CreateProfileIdOpnd(profileId, func),
        insertInstr);
    InsertMove(
        IR::IndirOpnd::New(resultObjOpnd, Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef(), TyMachReg, func),
        IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, func),
        insertInstr);
    insertInstr->InsertBefore(labelDone);

    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}